

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool __thiscall
vkt::tessellation::anon_unknown_0::
LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
::operator()(LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
             *this,Vector<tcu::Vector<float,_3>,_3> *a,Vector<tcu::Vector<float,_3>,_3> *b)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  Vector<float,_3> *b_00;
  Vector<tcu::Vector<float,_3>,_3> *extraout_RDX;
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    uVar3 = uVar2;
    if (uVar2 == 3) goto LAB_00729ecc;
    bVar1 = LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::operator()
                      ((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)this,a->m_data,
                       b->m_data);
    if (bVar1) {
      uVar3 = 1;
      goto LAB_00729ecc;
    }
    bVar1 = LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::operator()
                      ((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)a,
                       (Vector<float,_3> *)this,b_00);
    a = (Vector<tcu::Vector<float,_3>,_3> *)((long)a + 0xc);
    this = (LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
            *)((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)this + 0xc);
    uVar3 = uVar2 + 1;
    b = extraout_RDX;
  } while (!bVar1);
  uVar3 = 0;
LAB_00729ecc:
  return (bool)(uVar2 < 3 & (byte)uVar3);
}

Assistant:

bool operator() (const SeqT& a, const SeqT& b) const
	{
		for (int i = 0; i < Size; ++i)
		{
			if (m_pred(a[i], b[i]))
				return true;
			if (m_pred(b[i], a[i]))
				return false;
		}
		return false;
	}